

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O1

shared_ptr<MyCompiler::Ident> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Ident>(RecursiveDescentParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Ident> sVar1;
  string local_40;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Ident,std::allocator<MyCompiler::Ident>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Ident **)this,
             (allocator<MyCompiler::Ident> *)&local_40);
  if (in_RSI->sym != IDENT) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"identifier expected","");
    except(in_RSI,IDENT,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  Token::getValue_abi_cxx11_(&in_RSI->currentToken);
  std::__cxx11::string::_M_assign((string *)(this->stream + 0x28));
  nextSym(in_RSI);
  sVar1.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Ident>)
         sVar1.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Ident> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Ident>();

    if (sym != SymbolType::IDENT)
        except(SymbolType::IDENT, "identifier expected");
    pResult->value = currentToken.getValue();
    accept(sym);

    return pResult;
}